

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall libchars::command_cursor::command_cursor(command_cursor *this,command_cursor *n)

{
  command_node *pcVar1;
  size_t sVar2;
  
  std::
  stack<libchars::command_node*,std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>>
  ::stack<std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>,void>
            (&this->S);
  (this->w)._M_dataplus._M_p = (pointer)&(this->w).field_2;
  (this->w)._M_string_length = 0;
  (this->w).field_2._M_local_buf[0] = '\0';
  pcVar1 = current(n);
  this->root = pcVar1;
  this->idx = 0;
  if ((n->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur ==
      (n->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    sVar2 = n->root_idx;
  }
  else {
    sVar2 = 0;
  }
  this->root_idx = sVar2 + n->idx;
  return;
}

Assistant:

command_cursor::command_cursor(const command_cursor &n) :
        root(n.current()),idx(0)
    {
        if (n.S.empty())
            root_idx = n.root_idx + n.idx;
        else
            root_idx = n.idx;
    }